

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall
FlowGraph::RemoveBlock(FlowGraph *this,BasicBlock *block,GlobOpt *globOpt,bool tailDuping)

{
  Type pSVar1;
  code *pcVar2;
  FlowEdge **ppFVar3;
  NodeBase *pNVar4;
  NodeBase *this_00;
  bool bVar5;
  IRKind IVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  LabelInstr *pLVar9;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar10;
  Type_conflict pSVar11;
  Type *ppFVar12;
  BasicBlock *pBVar13;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar14;
  bool local_c1;
  Instr *local_b8;
  Loop **local_a8;
  Loop **pPrevLoop;
  FlowEdge **edge_1;
  Iterator __iter_1;
  FlowEdge **edge;
  Iterator __iter;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  Instr *lastInstr;
  bool tailDuping_local;
  GlobOpt *globOpt_local;
  BasicBlock *block_local;
  FlowGraph *this_local;
  
  if (((*(ushort *)&block->field_0x18 >> 1 & 1) != 0) || ((*(ushort *)&block->field_0x18 & 1) != 0))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd34,"(!block->isDead && !block->isDeleted)",
                       "!block->isDead && !block->isDeleted");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  instrNext = (Instr *)0x0;
  pIVar8 = BasicBlock::GetLastInstr(block);
  if (pIVar8 == (Instr *)0x0) {
    local_b8 = (Instr *)0x0;
  }
  else {
    pIVar8 = BasicBlock::GetLastInstr(block);
    local_b8 = pIVar8->m_next;
  }
  __iter.current = (NodeBase *)BasicBlock::GetFirstInstr(block);
  while ((pNVar4 = __iter.current, (Instr *)__iter.current != local_b8 &&
         (pSVar1 = __iter.current[2].next, *(short *)&__iter.current[6].next != 0x178))) {
    pIVar8 = BasicBlock::GetFirstInstr(block);
    this_00 = __iter.current;
    if ((Instr *)pNVar4 == pIVar8) {
      IVar6 = IR::Instr::GetKind((Instr *)__iter.current);
      local_c1 = true;
      if (IVar6 != InstrKindLabel) {
        local_c1 = IR::Instr::IsProfiledLabelInstr((Instr *)this_00);
      }
      if (local_c1 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0xd41,"(instr->IsLabelInstr())","instr->IsLabelInstr()");
        if (!bVar5) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      pLVar9 = IR::Instr::AsLabelInstr((Instr *)__iter.current);
      pLVar9->field_0x78 = pLVar9->field_0x78 & 0xfe;
      pLVar9 = IR::Instr::AsLabelInstr((Instr *)__iter.current);
      pLVar9->field_0x78 = pLVar9->field_0x78 & 0xfb;
      __iter.current = pSVar1;
    }
    else {
      instrNext = RemoveInstr(this,(Instr *)__iter.current,globOpt);
      __iter.current = pSVar1;
    }
  }
  if (instrNext != (Instr *)0x0) {
    BasicBlock::SetLastInstr(block,instrNext);
  }
  pSVar10 = &BasicBlock::GetPredList(block)->
             super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  _edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar10);
  while( true ) {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppFVar3 = edge;
    pSVar11 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3,pSVar11);
    if (bVar5) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    __iter_1.current =
         (NodeBase *)
         SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data((Iterator *)&edge)
    ;
    pBVar13 = FlowEdge::GetPred((FlowEdge *)(__iter_1.current)->next);
    BasicBlock::RemoveSucc(pBVar13,block,this,false,globOpt != (GlobOpt *)0x0);
  }
  pSVar10 = &BasicBlock::GetSuccList(block)->
             super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
  _edge_1 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar10);
  while( true ) {
    if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    ppFVar3 = edge_1;
    pSVar11 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar3,pSVar11);
    if (bVar5) break;
    SListNodeBase<Memory::ArenaAllocator>::Next
              (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)&edge_1);
    pBVar13 = FlowEdge::GetSucc(*ppFVar12);
    BasicBlock::RemovePred(pBVar13,block,this,false,globOpt != (GlobOpt *)0x0);
  }
  if (((*(ushort *)&block->field_0x18 >> 2 & 1) != 0) && (this->loopList != (Loop *)0x0)) {
    for (local_a8 = &this->loopList; *local_a8 != block->loop; local_a8 = &(*local_a8)->next) {
    }
    *local_a8 = (*local_a8)->next;
    this->hasLoop = this->loopList != (Loop *)0x0;
  }
  if (globOpt != (GlobOpt *)0x0) {
    *(ushort *)&block->field_0x18 = *(ushort *)&block->field_0x18 & 0xfffd | 2;
    pSVar10 = &BasicBlock::GetPredList(block)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    pSVar14 = &BasicBlock::GetDeadPredList(block)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveTo(pSVar10,pSVar14);
    pSVar10 = &BasicBlock::GetSuccList(block)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    pSVar14 = &BasicBlock::GetDeadSuccList(block)->
               super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::MoveTo(pSVar10,pSVar14);
  }
  if (tailDuping) {
    *(ushort *)&block->field_0x18 = *(ushort *)&block->field_0x18 & 0xfffd | 2;
  }
  *(ushort *)&block->field_0x18 = *(ushort *)&block->field_0x18 & 0xfffe | 1;
  BasicBlock::SetDataUseCount(block,0);
  return;
}

Assistant:

void
FlowGraph::RemoveBlock(BasicBlock *block, GlobOpt * globOpt, bool tailDuping)
{
    Assert(!block->isDead && !block->isDeleted);
    IR::Instr * lastInstr = nullptr;
    FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrNext, block)
    {
        if (instr->m_opcode == Js::OpCode::FunctionExit)
        {
            // Removing FunctionExit causes problems downstream...
            // We could change the opcode, or have FunctionEpilog/FunctionExit to get
            // rid of the epilog.
            break;
        }
        if (instr == block->GetFirstInstr())
        {
            Assert(instr->IsLabelInstr());
            instr->AsLabelInstr()->m_isLoopTop = false;
            instr->AsLabelInstr()->m_hasNonBranchRef = false;
        }
        else
        {
            lastInstr = this->RemoveInstr(instr, globOpt);
        }
    } NEXT_INSTR_IN_BLOCK_EDITING;

    if (lastInstr)
    {
        block->SetLastInstr(lastInstr);
    }
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetPredList())
    {
        edge->GetPred()->RemoveSucc(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, block->GetSuccList())
    {
        edge->GetSucc()->RemovePred(block, this, false, globOpt != nullptr);
    } NEXT_SLISTBASECOUNTED_ENTRY;

    if (block->isLoopHeader && this->loopList)
    {
        // If loop graph is built, remove loop from loopList
        Loop **pPrevLoop = &this->loopList;

        while (*pPrevLoop != block->loop)
        {
            pPrevLoop = &((*pPrevLoop)->next);
        }
        *pPrevLoop = (*pPrevLoop)->next;
        this->hasLoop = (this->loopList != nullptr);
    }
    if (globOpt != nullptr)
    {
        block->isDead = true;
        block->GetPredList()->MoveTo(block->GetDeadPredList());
        block->GetSuccList()->MoveTo(block->GetDeadSuccList());
    }
    if (tailDuping)
    {
        block->isDead = true;
    }
    block->isDeleted = true;
    block->SetDataUseCount(0);
}